

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O1

void Fra_FraigSweep(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Fra_Par_t *pFVar5;
  int Pos;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  pAVar3 = p->pManAig;
  uVar10 = pAVar3->nObjs[2] - pAVar3->nRegs;
  pVVar6 = pAVar3->vCis;
  Pos = 0;
  if ((int)uVar10 < pVVar6->nSize) {
    uVar8 = (ulong)uVar10;
    Pos = 0;
    do {
      if ((int)uVar10 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar4 = (Aig_Obj_t *)pVVar6->pArray[uVar8];
      Fra_FraigNode(p,pAVar4);
      if (p->pPars->fUseImps != 0) {
        Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar4,Pos);
      }
      uVar8 = uVar8 + 1;
      pVVar6 = p->pManAig->vCis;
    } while ((int)uVar8 < pVVar6->nSize);
  }
  if (p->pPars->fLatchCorr == 0) {
    pVVar6 = p->pManAig->vObjs;
    if (0 < pVVar6->nSize) {
      iVar1 = p->pPars->nBTLimitNode;
      lVar9 = 0;
      do {
        pAVar4 = (Aig_Obj_t *)pVVar6->pArray[lVar9];
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
          if (((ulong)pAVar4 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fra.h"
                          ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
          }
          iVar2 = p->pPars->nFramesK;
          uVar8 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                     *(ulong *)(*(long *)(*(long *)(uVar8 + 0x28) + 0x20) +
                               (long)(*(int *)(uVar8 + 0x24) *
                                      *(int *)(*(long *)(uVar8 + 0x28) + 0x18) + iVar2) * 8));
          }
          uVar8 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar4->pFanin1 & 1) ^
                 *(ulong *)(*(long *)(*(long *)(uVar8 + 0x28) + 0x20) +
                           (long)(*(int *)(uVar8 + 0x24) * *(int *)(*(long *)(uVar8 + 0x28) + 0x18)
                                 + iVar2) * 8));
          }
          pAVar7 = Aig_And(p->pManFraig,pAVar7,p1);
          *(Aig_Obj_t **)
           (*(long *)((long)(pAVar4->field_5).pData + 0x20) +
           ((long)pAVar4->Id * (long)*(int *)((long)(pAVar4->field_5).pData + 0x18) +
           (long)p->pPars->nFramesK) * 8) = pAVar7;
          *(Fra_Man_t **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x28) = p;
          if (p->pManFraig->pData == (void *)0x0) {
            iVar2 = p->pPars->nLevelMax;
            if ((iVar2 != 0) && (iVar2 < (int)(*(uint *)&pAVar4->field_0x1c & 0xffffff))) {
              p->pPars->nBTLimitNode = 5;
            }
            Fra_FraigNode(p,pAVar4);
            pFVar5 = p->pPars;
            if ((pFVar5->nLevelMax != 0) &&
               (pFVar5->nLevelMax < (int)(*(uint *)&pAVar4->field_0x1c & 0xffffff))) {
              pFVar5->nBTLimitNode = iVar1;
            }
            if (pFVar5->fUseImps != 0) {
              Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar4,Pos);
            }
          }
        }
        lVar9 = lVar9 + 1;
        pVVar6 = p->pManAig->vObjs;
      } while (lVar9 < pVVar6->nSize);
    }
    p->nNodesMiter = p->pManFraig->nObjs[6] + p->pManFraig->nObjs[5];
    if (p->pPars->fUseImps != 0) {
      Fra_ImpCompactArray(p->pCla->vImps);
      return;
    }
  }
  return;
}

Assistant:

void Fra_FraigSweep( Fra_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Pos = 0;
    int nBTracksOld;
    // fraig latch outputs
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Fra_FraigNode( p, pObj );
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
    if ( p->pPars->fLatchCorr )
        return;
    // fraig internal nodes
//    if ( !p->pPars->fDontShowBar )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pManAig) );
    nBTracksOld = p->pPars->nBTLimitNode;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
//        if ( pProgress )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // derive and remember the new fraig node
        pObjNew = Aig_And( p->pManFraig, Fra_ObjChild0Fra(pObj,p->pPars->nFramesK), Fra_ObjChild1Fra(pObj,p->pPars->nFramesK) );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjNew );
        Aig_Regular(pObjNew)->pData = p;
        // quit if simulation detected a counter-example for a PO
        if ( p->pManFraig->pData )
            continue;
//        if ( Aig_SupportSize(p->pManAig,pObj) > 16 )
//            continue;
        // perform fraiging
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = 5;
        Fra_FraigNode( p, pObj );
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = nBTracksOld;
        // check implications
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
//    if ( pProgress )
//        Bar_ProgressStop( pProgress );
    // try to prove the outputs of the miter
    p->nNodesMiter = Aig_ManNodeNum(p->pManFraig);
//    Fra_MiterStatus( p->pManFraig );
//    if ( p->pPars->fProve && p->pManFraig->pData == NULL )
//        Fra_MiterProve( p );
    // compress implications after processing all of them
    if ( p->pPars->fUseImps )
        Fra_ImpCompactArray( p->pCla->vImps );
}